

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_context_createIntrinsicAbstractPrimitiveValueType
          (sysbvm_context_t *context,char *name,sysbvm_tuple_t supertype,size_t instanceSize,
          size_t instanceAlignment)

{
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t value;
  sysbvm_tuple_t type;
  sysbvm_tuple_t nameSymbol;
  size_t instanceAlignment_local;
  size_t instanceSize_local;
  sysbvm_tuple_t supertype_local;
  char *name_local;
  sysbvm_context_t *context_local;
  
  sVar1 = sysbvm_symbol_internWithCString(context,name);
  value = sysbvm_type_createAnonymousAbstractPrimitiveValueTypeAndValueMetatype(context,supertype);
  sysbvm_namespace_setNewSymbolBindingWithValue
            (context,(context->roots).globalNamespace,sVar1,value);
  sysbvm_orderedCollection_add(context,(context->roots).intrinsicTypes,value);
  sVar1 = sysbvm_array_create(context,0);
  sysbvm_type_setSlots(value,sVar1);
  sysbvm_type_setTotalSlotCount(context,value,0);
  sysbvm_type_setInstanceSizeAndAlignment(context,value,instanceSize,instanceAlignment);
  sysbvm_type_buildSlotDictionary(context,value);
  return value;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_context_createIntrinsicAbstractPrimitiveValueType(sysbvm_context_t *context, const char *name, sysbvm_tuple_t supertype, size_t instanceSize, size_t instanceAlignment)
{
    sysbvm_tuple_t nameSymbol = sysbvm_symbol_internWithCString(context, name);
    sysbvm_tuple_t type = sysbvm_type_createAnonymousAbstractPrimitiveValueTypeAndValueMetatype(context, supertype);
    sysbvm_namespace_setNewSymbolBindingWithValue(context, context->roots.globalNamespace, nameSymbol, type);
    sysbvm_orderedCollection_add(context, context->roots.intrinsicTypes, type);

    sysbvm_type_setSlots(type, sysbvm_array_create(context, 0));
    sysbvm_type_setTotalSlotCount(context, type, 0);
    sysbvm_type_setInstanceSizeAndAlignment(context, type, instanceSize, instanceAlignment);
    sysbvm_type_buildSlotDictionary(context, type);
    return type;
}